

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

void NULLC::FinalizePending(void)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  ExternTypeInfo *elementType;
  long lVar5;
  ulong uVar6;
  
  if (DAT_0041eec4 != 0) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      lVar2 = *(long *)(blocksToFinalize + lVar5);
      uVar3 = *(ulong *)(lVar2 + 4);
      *(ulong *)(lVar2 + 4) = uVar3 | 1;
      uVar4 = (uint)(uVar3 >> 8) & 0xffffff;
      if (*(uint *)(linker + 0x20c) <= uVar4) {
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x7f,
                      "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
                     );
      }
      elementType = (ExternTypeInfo *)((ulong)(uVar4 * 0x50) + *(long *)(linker + 0x200));
      if ((uVar3 & 0x10) == 0) {
        GC::CheckVariable((char *)(lVar2 + 0xc),elementType);
      }
      else {
        uVar4._0_1_ = elementType->defaultAlign;
        uVar4._1_1_ = elementType->typeFlags;
        uVar4._2_2_ = elementType->pointerCount;
        if ((byte)(undefined1)uVar4 < 5) {
          uVar4 = 4;
        }
        lVar1 = lVar2 + (ulong)(uVar4 & 0xff);
        GC::CheckArrayElements((char *)(lVar1 + 0xc),*(uint *)(lVar1 + 8),elementType);
      }
      FinalizeObject((markerType *)(lVar2 + 4),(char *)(lVar2 + 4));
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar6 < DAT_0041eec4);
  }
  DAT_0041eec4 = 0;
  ObjectBlockPool<8,_8192>::FinalizePending((ObjectBlockPool<8,_8192> *)pool8);
  ObjectBlockPool<16,_4096>::FinalizePending((ObjectBlockPool<16,_4096> *)pool16);
  ObjectBlockPool<32,_2048>::FinalizePending((ObjectBlockPool<32,_2048> *)pool32);
  ObjectBlockPool<64,_1024>::FinalizePending((ObjectBlockPool<64,_1024> *)pool64);
  ObjectBlockPool<128,_512>::FinalizePending((ObjectBlockPool<128,_512> *)pool128);
  ObjectBlockPool<256,_256>::FinalizePending((ObjectBlockPool<256,_256> *)pool256);
  ObjectBlockPool<512,_128>::FinalizePending((ObjectBlockPool<512,_128> *)pool512);
  GC::MarkPendingRoots();
  return;
}

Assistant:

void NULLC::FinalizePending()
{
	for(unsigned i = 0; i < blocksToFinalize.size(); i++)
	{
		Range &curr = blocksToFinalize[i];

		void *block = curr.start;

		markerType &marker = *(markerType*)((char*)block + 4);

		// Mark block as used
		marker |= NULLC::OBJECT_VISIBLE;

		ExternTypeInfo &typeInfo = NULLC::linker->exTypes[(unsigned)marker >> 8];

		char *base = (char*)block + 4;

		if(marker & NULLC::OBJECT_ARRAY)
		{
			unsigned arrayPadding = typeInfo.defaultAlign > 4 ? typeInfo.defaultAlign : 4;

			unsigned count = *(unsigned*)(base + sizeof(markerType) + arrayPadding - 4);

			GC::CheckArrayElements(base + sizeof(markerType) + arrayPadding, count, typeInfo);
		}
		else
		{
			GC::CheckVariable(base + sizeof(markerType), typeInfo);
		}

		NULLC::FinalizeObject(marker, (char*)block + 4);
	}

	blocksToFinalize.clear();

	pool8.FinalizePending();
	pool16.FinalizePending();
	pool32.FinalizePending();
	pool64.FinalizePending();
	pool128.FinalizePending();
	pool256.FinalizePending();
	pool512.FinalizePending();

	// Mark new roots
	GC::MarkPendingRoots();
}